

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O2

void absl::cord_internal::CordRepBtree::Destroy(CordRepBtree *tree)

{
  uint8_t uVar1;
  byte bVar2;
  byte bVar3;
  CordRep *pCVar4;
  CordRep *pCVar5;
  bool bVar6;
  CordRepBtree *pCVar7;
  CordRepBtree *tree_00;
  long lVar8;
  iterator __begin2;
  CordRep **ppCVar9;
  
  uVar1 = (tree->super_CordRep).storage[0];
  bVar2 = (tree->super_CordRep).storage[1];
  bVar3 = (tree->super_CordRep).storage[2];
  if (uVar1 == '\0') {
    for (lVar8 = (ulong)bVar2 << 3; (ulong)bVar3 * 8 != lVar8; lVar8 = lVar8 + 8) {
      pCVar4 = *(CordRep **)((long)tree->edges_ + lVar8);
      bVar6 = RefcountAndFlags::Decrement(&pCVar4->refcount);
      if (!bVar6) {
        anon_unknown_0::DeleteLeafEdge(pCVar4);
      }
    }
  }
  else {
    ppCVar9 = tree->edges_ + bVar2;
    if (uVar1 == '\x01') {
      for (; ppCVar9 != tree->edges_ + bVar3; ppCVar9 = ppCVar9 + 1) {
        pCVar4 = *ppCVar9;
        bVar6 = RefcountAndFlags::Decrement(&pCVar4->refcount);
        if (!bVar6) {
          pCVar7 = CordRep::btree(pCVar4);
          bVar2 = (pCVar7->super_CordRep).storage[2];
          for (lVar8 = (ulong)(pCVar7->super_CordRep).storage[1] << 3; (ulong)bVar2 * 8 != lVar8;
              lVar8 = lVar8 + 8) {
            pCVar5 = *(CordRep **)((long)pCVar7->edges_ + lVar8);
            bVar6 = RefcountAndFlags::Decrement(&pCVar5->refcount);
            if (!bVar6) {
              anon_unknown_0::DeleteLeafEdge(pCVar5);
            }
          }
          pCVar7 = CordRep::btree(pCVar4);
          Delete(pCVar7);
        }
      }
    }
    else {
      for (; ppCVar9 != tree->edges_ + bVar3; ppCVar9 = ppCVar9 + 1) {
        pCVar4 = *ppCVar9;
        bVar6 = RefcountAndFlags::Decrement(&pCVar4->refcount);
        if (!bVar6) {
          pCVar7 = CordRep::btree(pCVar4);
          bVar2 = (pCVar7->super_CordRep).storage[2];
          for (lVar8 = (ulong)(pCVar7->super_CordRep).storage[1] << 3; (ulong)bVar2 * 8 != lVar8;
              lVar8 = lVar8 + 8) {
            pCVar5 = *(CordRep **)((long)pCVar7->edges_ + lVar8);
            bVar6 = RefcountAndFlags::Decrement(&pCVar5->refcount);
            if (!bVar6) {
              tree_00 = CordRep::btree(pCVar5);
              Destroy(tree_00);
            }
          }
          pCVar7 = CordRep::btree(pCVar4);
          Delete(pCVar7);
        }
      }
    }
  }
  Delete(tree);
  return;
}

Assistant:

inline CordRepBtree* Unwind(CordRepBtree* tree, int depth, size_t length,
                              OpResult result) {
    // TODO(mvels): revisit the below code to check if 3 loops with 3
    // (incremental) conditions is faster than 1 loop with a switch.
    // Benchmarking and perf recordings indicate the loop with switch is
    // fastest, likely because of indirect jumps on the tight case values and
    // dense branches. But it's worth considering 3 loops, as the `action`
    // transitions are mono directional. E.g.:
    //   while (action == kPopped) {
    //     ...
    //   }
    //   while (action == kCopied) {
    //     ...
    //   }
    //   ...
    // We also  found that an "if () do {}" loop here seems faster, possibly
    // because it allows the branch predictor more granular heuristics on
    // 'single leaf' (`depth` == 0) and 'single depth' (`depth` == 1) cases
    // which appear to be the most common use cases.
    if (depth != 0) {
      do {
        CordRepBtree* node = stack[--depth];
        const bool owned = depth < share_depth;
        switch (result.action) {
          case CordRepBtree::kPopped:
            assert(!propagate);
            result = node->AddEdge<edge_type>(owned, result.tree, length);
            break;
          case CordRepBtree::kCopied:
            result = node->SetEdge<edge_type>(owned, result.tree, length);
            if (propagate) stack[depth] = result.tree;
            break;
          case CordRepBtree::kSelf:
            node->length += length;
            while (depth > 0) {
              node = stack[--depth];
              node->length += length;
            }
            return node;
        }
      } while (depth > 0);
    }
    return Finalize(tree, result);
  }